

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
embree::ImageT<embree::Col4<unsigned_char>_>::set
          (ImageT<embree::Col4<unsigned_char>_> *this,size_t x,size_t y,Color4 *c)

{
  Col4<unsigned_char> *pCVar1;
  undefined1 auVar2 [16];
  undefined1 local_2b8 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  Color4 *c_local;
  size_t y_local;
  size_t x_local;
  ImageT<embree::Col4<unsigned_char>_> *this_local;
  vfloat4 s;
  
  pCVar1 = this->data + y * (this->super_Image).width + x;
  auVar2._8_8_ = 0x3f8000003f800000;
  auVar2._0_8_ = 0x3f8000003f800000;
  auVar2 = minps((undefined1  [16])c->field_0,auVar2);
  auVar2 = maxps(auVar2,local_2b8);
  local_1f8 = auVar2._0_4_;
  fStack_1f4 = auVar2._4_4_;
  fStack_1f0 = auVar2._8_4_;
  fStack_1ec = auVar2._12_4_;
  pCVar1->r = (uchar)(int)(local_1f8 * 255.0);
  pCVar1->g = (uchar)(int)(fStack_1f4 * 255.0);
  pCVar1->b = (uchar)(int)(fStack_1f0 * 255.0);
  pCVar1->a = (uchar)(int)(fStack_1ec * 255.0);
  return;
}

Assistant:

__forceinline void set(size_t x, size_t y, const Color4& c) { 
      c.set(data[y*width+x]); 
    }